

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll-test.c
# Opt level: O3

void sleep_argument_impl(int sleep)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  undefined8 uVar4;
  int fds [3];
  pthread_t writer_thread;
  epoll_event event;
  int local_3c;
  int local_38;
  int local_34;
  pthread_t local_30;
  uint32_t local_24;
  
  iVar1 = epoll_create1(0x80000);
  if (iVar1 < 0) {
    pcVar3 = "ep >= 0";
    uVar4 = 0x1d2;
  }
  else {
    fd_pipe(&local_3c);
    local_24 = 1;
    iVar2 = epoll_ctl(iVar1,1,local_3c,(epoll_event *)&local_24);
    if (iVar2 < 0) {
      pcVar3 = "epoll_ctl(ep, EPOLL_CTL_ADD, fds[0], &event) >= 0";
      uVar4 = 0x1da;
    }
    else {
      iVar2 = pthread_create(&local_30,(pthread_attr_t *)0x0,sleep_then_write,(void *)(long)local_38
                            );
      if (iVar2 == 0) {
        iVar2 = epoll_wait(iVar1,(epoll_event *)&local_24,1,sleep);
        if (iVar2 == 1) {
          iVar2 = pthread_join(local_30,(void **)0x0);
          if (iVar2 == 0) {
            iVar2 = close(local_3c);
            if (iVar2 == 0) {
              iVar2 = close(local_38);
              if (iVar2 == 0) {
                if (local_34 != -1) {
                  iVar2 = close(local_34);
                  if (iVar2 != 0) {
                    pcVar3 = "fds[2] == -1 || close(fds[2]) == 0";
                    uVar4 = 0x1e6;
                    goto LAB_00104c65;
                  }
                }
                iVar1 = close(iVar1);
                if (iVar1 == 0) {
                  return;
                }
                pcVar3 = "close(ep) == 0";
                uVar4 = 0x1e7;
              }
              else {
                pcVar3 = "close(fds[1]) == 0";
                uVar4 = 0x1e5;
              }
            }
            else {
              pcVar3 = "close(fds[0]) == 0";
              uVar4 = 0x1e4;
            }
          }
          else {
            pcVar3 = "pthread_join(writer_thread, NULL) == 0";
            uVar4 = 0x1e2;
          }
        }
        else {
          pcVar3 = "epoll_wait(ep, &event, 1, sleep) == 1";
          uVar4 = 0x1e0;
        }
      }
      else {
        pcVar3 = 
        "pthread_create(&writer_thread, NULL, sleep_then_write, (void *)(intptr_t)(fds[1])) == 0";
        uVar4 = 0x1de;
      }
    }
  }
LAB_00104c65:
  microatf_fail_require
            ("%s:%d: %s not met",
             "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/epoll-test.c"
             ,uVar4,pcVar3);
}

Assistant:

static void
sleep_argument_impl(int sleep)
{
	int ep = epoll_create1(EPOLL_CLOEXEC);
	ATF_REQUIRE(ep >= 0);

	int fds[3];
	fd_pipe(fds);

	struct epoll_event event;
	event.events = EPOLLIN;

	ATF_REQUIRE(epoll_ctl(ep, EPOLL_CTL_ADD, fds[0], &event) >= 0);

	pthread_t writer_thread;
	ATF_REQUIRE(pthread_create(&writer_thread, NULL, sleep_then_write,
			(void *)(intptr_t)(fds[1])) == 0);

	ATF_REQUIRE(epoll_wait(ep, &event, 1, sleep) == 1);

	ATF_REQUIRE(pthread_join(writer_thread, NULL) == 0);

	ATF_REQUIRE(close(fds[0]) == 0);
	ATF_REQUIRE(close(fds[1]) == 0);
	ATF_REQUIRE(fds[2] == -1 || close(fds[2]) == 0);
	ATF_REQUIRE(close(ep) == 0);
}